

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

void mjs::debug_print(wostream *os,value *v,int indent_incr,int max_nest,int indent)

{
  uint uVar1;
  int iVar2;
  object *this;
  wostream *pwVar3;
  uint *puVar4;
  long lVar5;
  char *pcVar6;
  object_ptr b;
  undefined1 local_60 [32];
  gc_heap_ptr_untyped local_40;
  
  switch(v->type_) {
  case undefined:
  case null:
    pcVar6 = string_value(v->type_);
    break;
  case boolean:
    pcVar6 = "false";
    if ((v->field_1).b_ != false) {
      pcVar6 = "true";
    }
    break;
  case number:
    number_to_string_abi_cxx11_((wstring *)local_60,(mjs *)v,(v->field_1).n_);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (os,(wchar_t *)local_60._0_8_,CONCAT44(local_60._12_4_,local_60._8_4_));
    if ((gc_heap *)local_60._0_8_ == (gc_heap *)(local_60 + 0x10)) {
      return;
    }
    operator_delete((void *)local_60._0_8_,local_60._16_8_ * 4 + 4);
    return;
  case string:
    std::operator<<(os,"\'");
    if (v->type_ != string) {
      __assert_fail("type_ == value_type::string",
                    "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                    0x45,"const string &mjs::value::string_value() const");
    }
    puVar4 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(v->field_1).s_);
    uVar1 = *puVar4;
    if ((ulong)uVar1 != 0) {
      lVar5 = 0;
      do {
        iVar2 = *(int *)((long)puVar4 + lVar5 + 4);
        switch(iVar2) {
        case 8:
          pcVar6 = "\\b";
          break;
        case 9:
          pcVar6 = "\\t";
          break;
        case 10:
          pcVar6 = "\\n";
          break;
        case 0xb:
switchD_00163410_caseD_b:
          local_60._0_4_ = iVar2;
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(wchar_t *)local_60,1);
          goto LAB_00163489;
        case 0xc:
          pcVar6 = "\\f";
          break;
        case 0xd:
          pcVar6 = "\\r";
          break;
        default:
          if (iVar2 == 0x5c) {
            pcVar6 = "\\\\";
          }
          else {
            if (iVar2 != 0x27) goto switchD_00163410_caseD_b;
            pcVar6 = "\\\'";
          }
        }
        std::operator<<(os,pcVar6);
LAB_00163489:
        lVar5 = lVar5 + 4;
      } while ((ulong)uVar1 << 2 != lVar5);
    }
LAB_001634f7:
    std::operator<<(os,"\'");
    return;
  case object:
    this = (object *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(v->field_1).s_);
    object::debug_print(this,os,indent_incr,max_nest,indent);
    return;
  case reference:
    std::operator<<(os,"reference to ");
    if (v->type_ == reference) {
      local_60._0_8_ =
           (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
      local_60._8_4_ = *(uint32_t *)((long)&v->field_1 + 8);
      if ((gc_heap *)local_60._0_8_ != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_60._0_8_,(gc_heap_ptr_untyped *)local_60);
      }
      if ((gc_heap *)local_60._0_8_ == (gc_heap *)0x0) {
        std::operator<<(os,"null");
      }
      else {
        gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)local_60);
        object::class_name((object *)&local_40);
        operator<<(os,(string *)&local_40);
        gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
      }
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_60);
      pwVar3 = std::operator<<(os," \'");
      if (v->type_ == reference) {
        puVar4 = (uint *)gc_heap_ptr_untyped::get
                                   ((gc_heap_ptr_untyped *)&(v->field_1).r_.property_name_);
        os = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                       (pwVar3,(wchar_t *)(puVar4 + 1),(ulong)*puVar4);
        goto LAB_001634f7;
      }
    }
    __assert_fail("type_ == value_type::reference",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.h",
                  0x47,"const reference &mjs::value::reference_value() const");
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp",
                  0x113,"void mjs::debug_print(std::wostream &, const value &, int, int, int)");
  }
  std::operator<<(os,pcVar6);
  return;
}

Assistant:

void debug_print(std::wostream& os, const value& v, int indent_incr, int max_nest, int indent) {
    switch (v.type()) {
    case value_type::undefined: [[fallthrough]];
    case value_type::null:
        os << v.type();
        break;
    case value_type::boolean:
        os << (v.boolean_value() ? "true" : "false");
        break;
    case value_type::number:
        os << number_to_string(v.number_value());
        break;
    case value_type::string:
        os << "'";
        for (const auto& ch: v.string_value().view()) {
            switch (ch) {
            case '\'': os << "\\'"; break;
            case '\\': os << "\\\\"; break;
            case '\b': os << "\\b"; break;
            case '\f': os << "\\f"; break;
            case '\n': os << "\\n"; break;
            case '\r': os << "\\r"; break;
            case '\t': os << "\\t"; break;
            default:
                os << ch;
            }
        }
        os << "'";
        break;
    case value_type::object:
        v.object_value()->debug_print(os, indent_incr, max_nest, indent);
        break;
    case value_type::reference:
        os << "reference to ";
        if (auto b = v.reference_value().base()) {
            os << b->class_name();
        } else {
            os << "null";
        }
        os << " '" << v.reference_value().property_name().view() << "'";
        break;
    default:
        assert(false);
        os << "[Unhandled type " << v.type() << "]";
    }
}